

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reduce(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reduce(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reduce(this);
    this_00 = (ReduceLayerParams *)operator_new(0x20);
    ReduceLayerParams::ReduceLayerParams(this_00);
    (this->layer_).reduce_ = this_00;
  }
  return (ReduceLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceLayerParams* NeuralNetworkLayer::mutable_reduce() {
  if (!has_reduce()) {
    clear_layer();
    set_has_reduce();
    layer_.reduce_ = new ::CoreML::Specification::ReduceLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduce)
  return layer_.reduce_;
}